

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O1

void __thiscall TPZIntPrism3D::SetOrder(TPZIntPrism3D *this,TPZVec<int> *ord,int type)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int type_00;
  TPZManVector<int,_2> prc1;
  TPZManVector<int,_2> prc2;
  TPZVec<int> local_80;
  int local_60 [2];
  TPZVec<int> local_58;
  int local_38;
  int local_34;
  
  piVar1 = ord->fStore;
  this->fOrdKsi = *piVar1;
  iVar3 = piVar1[2];
  if (piVar1[2] < piVar1[1]) {
    iVar3 = piVar1[1];
  }
  this->fOrdKti = iVar3;
  TPZVec<int>::TPZVec(&local_80,0);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018443d0;
  local_80.fNElements = 1;
  local_80.fNAlloc = 0;
  local_80.fStore = local_60;
  TPZVec<int>::TPZVec(&local_58,0);
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018443d0;
  local_58.fNElements = 2;
  local_58.fNAlloc = 0;
  piVar1 = ord->fStore;
  local_58.fStore = &local_38;
  *local_80.fStore = *piVar1;
  local_38 = piVar1[1];
  local_34 = piVar1[2];
  TPZInt1d::SetOrder(&this->fIntRule1D,&local_80,type);
  TPZIntTriang::SetOrder(&this->fIntTriang,&local_58,type_00);
  piVar1 = local_80.fStore;
  *local_80.fStore = (this->fIntRule1D).fOrdKsi;
  piVar2 = local_58.fStore;
  iVar3 = (this->fIntTriang).fOrdKsi;
  *local_58.fStore = iVar3;
  piVar2[1] = iVar3;
  this->fOrdKsi = *piVar1;
  this->fOrdKti = *piVar2;
  if (piVar2 == &local_38) {
    local_58.fStore = (int *)0x0;
  }
  local_58.fNAlloc = 0;
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_58.fStore != (int *)0x0) {
    operator_delete__(local_58.fStore);
  }
  if (local_80.fStore == local_60) {
    local_80.fStore = (int *)0x0;
  }
  local_80.fNAlloc = 0;
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_80.fStore != (int *)0x0) {
    operator_delete__(local_80.fStore);
  }
  return;
}

Assistant:

void TPZIntPrism3D::SetOrder(TPZVec<int> &ord,int type) {	
	fOrdKsi = ord[0];   //ordem na reta : zeta
	fOrdKti = (ord[1] > ord[2]) ? ord[1] : ord[2];   //ordem no plano XY
	TPZManVector<int,2> prc1(1),prc2(2);
	prc1[0] = ord[0];
	prc2[0] = ord[1];
	prc2[1] = ord[2];
	fIntRule1D.SetOrder(prc1,type);
	fIntTriang.SetOrder(prc2);
    fIntRule1D.GetOrder(prc1);
    fIntTriang.GetOrder(prc2);
    fOrdKsi = prc1[0];
    fOrdKti = prc2[0];
}